

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_parser.hpp
# Opt level: O1

void __thiscall
jsoncons::csv::basic_csv_parser<char,_std::allocator<char>_>::before_value
          (basic_csv_parser<char,_std::allocator<char>_> *this,basic_json_visitor<char> *visitor,
          error_code *ec)

{
  csv_mode cVar1;
  pointer pbVar2;
  long lVar3;
  size_type local_28;
  pointer local_20;
  
  cVar1 = (this->stack_).
          super__Vector_base<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>.
          _M_impl.super__Vector_impl_data._M_finish[-1];
  if (cVar1 == data) {
    if (this->mapping_kind_ != n_objects) {
      return;
    }
    if ((this->ignore_empty_values_ == true) && ((this->buffer_)._M_string_length == 0)) {
      return;
    }
    pbVar2 = (this->column_names_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (((long)(this->column_names_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) + this->offset_ <=
        this->column_index_) {
      return;
    }
    lVar3 = this->column_index_ - this->offset_;
    local_20 = pbVar2[lVar3]._M_dataplus._M_p;
    local_28 = pbVar2[lVar3]._M_string_length;
    (*visitor->_vptr_basic_json_visitor[9])(visitor,&local_28,this,ec);
  }
  else {
    if (cVar1 != header) {
      return;
    }
    if ((this->trim_leading_inside_quotes_ != false) || (this->trim_trailing_inside_quotes_ == true)
       ) {
      trim_string_buffer(this,this->trim_leading_inside_quotes_,this->trim_trailing_inside_quotes_);
    }
    if (this->line_ != this->header_line_offset_ + this->header_line_) {
      return;
    }
    if (this->column_index_ < this->min_column_names_) {
      return;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->column_names_,&this->buffer_);
    if (this->assume_header_ != true) {
      return;
    }
    if (this->mapping_kind_ != n_rows) {
      return;
    }
    local_20 = (this->buffer_)._M_dataplus._M_p;
    local_28 = (this->buffer_)._M_string_length;
    (*visitor->_vptr_basic_json_visitor[0xc])(visitor,&local_28,0,this,ec);
  }
  this->more_ = (bool)(this->cursor_mode_ ^ 1);
  return;
}

Assistant:

void before_value(basic_json_visitor<CharT>& visitor, 
        std::error_code& ec)
    {
        switch (stack_.back())
        {
            case csv_mode::header:
                if (trim_leading_inside_quotes_ || trim_trailing_inside_quotes_)
                {
                    trim_string_buffer(trim_leading_inside_quotes_,trim_trailing_inside_quotes_);
                }
                if (line_ == (header_line_+header_line_offset_) && column_index_ >= min_column_names_)
                {
                    column_names_.push_back(buffer_);
                    if (assume_header_ && mapping_kind_ == csv_mapping_kind::n_rows)
                    {
                        visitor.string_value(buffer_, semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                    }
                }
                break;
            case csv_mode::data:
                if (mapping_kind_ == csv_mapping_kind::n_objects)
                {
                    if (!(ignore_empty_values_ && buffer_.empty()))
                    {
                        if (column_index_ < column_names_.size() + offset_)
                        {
                            visitor.key(column_names_[column_index_ - offset_], *this, ec);
                            more_ = !cursor_mode_;
                        }
                    }
                }
                break;
            default:
                break;
        }
    }